

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O2

void start_button_anims_proc(Am_Object *command_obj)

{
  uint uVar1;
  int iVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  Am_Object AVar5;
  Am_Object this;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object_Data local_50 [8];
  undefined1 local_48 [8];
  Am_Object local_40;
  Am_Object local_38;
  Am_Object_Method method;
  
  pAVar3 = (Am_Value *)Am_Object::Get(0xf2e0,0xca);
  Am_Object_Method::Am_Object_Method(&method,pAVar3);
  Am_Object::Am_Object(&local_38,command_obj);
  (*method.Call)((Am_Object_Data *)&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)command_obj,0x169);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  if (iVar2 == 2) {
    Am_Object::Am_Object(&local_58,&animated_button_color);
    Am_Abort_Animator((Am_Object_Data *)&local_58);
    Am_Object::~Am_Object(&local_58);
    poVar4 = std::operator<<((ostream *)&std::cout,"Turning on animations of ");
    poVar4 = (ostream *)operator<<(poVar4,&animated_button_bounce);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    Am_Object::Set(0xe520,true,1);
    Am_Object::Am_Object(&local_60,&animated_button_bounce);
    Am_Object::Am_Object(&local_68,(Am_Object *)&Am_No_Object);
    uVar1 = _Am_Default_Start_Char;
    Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
    this.data = (Am_Object_Data *)&local_60;
    Am_Start_Interactor(this,(Am_Object_Data *)&local_68,(Am_Input_Char *)(ulong)uVar1,
                        (Am_Object_Data *)&local_70,0,0,true);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_68);
  }
  else if (iVar2 == 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Turning on animations of ");
    poVar4 = (ostream *)operator<<(poVar4,&animated_button_color);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    this.data = local_50;
    AVar5.data = this.data;
    Am_Object::Am_Object((Am_Object *)this.data,command_obj);
    next_button_color_proc(AVar5);
  }
  else {
    if (iVar2 != 0) {
      return;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Turning OFF animations of ");
    poVar4 = (ostream *)operator<<(poVar4,&animated_button_color);
    poVar4 = std::operator<<(poVar4," and ");
    poVar4 = (ostream *)operator<<(poVar4,&animated_button_bounce);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ostream::flush();
    Am_Object::Am_Object(&local_40,&animated_button_color);
    Am_Abort_Animator((Am_Object_Data *)&local_40);
    Am_Object::~Am_Object(&local_40);
    this.data = (Am_Object_Data *)local_48;
    Am_Object::Am_Object((Am_Object *)this.data,&animated_button_bounce);
    Am_Abort_Interactor(this,true);
  }
  Am_Object::~Am_Object((Am_Object *)this.data);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, start_button_anims,
                 (Am_Object command_obj))
{
  //first, call the standard do
  Am_Object_Method method = Am_Cycle_Value_Command.Get(Am_DO_METHOD);
  method.Call(command_obj);
  //now see if need to start an animation
  int val = command_obj.Get(Am_VALUE);
  if (val == 0) { //just hit stop
    std::cout << "Turning OFF animations of " << animated_button_color
              << " and " << animated_button_bounce << std::endl
              << std::flush;
    Am_Abort_Animator(animated_button_color);
    Am_Abort_Interactor(animated_button_bounce);
  } else if (val == 1) { //just hit color
    std::cout << "Turning on animations of " << animated_button_color
              << std::endl
              << std::flush;
    next_button_color_proc(command_obj);
  } else if (val == 2) { //just hit position
    Am_Abort_Animator(animated_button_color);
    std::cout << "Turning on animations of " << animated_button_bounce
              << std::endl
              << std::flush;
    animated_button_bounce.Set(Am_ACTIVE, true);
    Am_Start_Interactor(animated_button_bounce);
  }
}